

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emacs.c
# Opt level: O0

el_action_t em_kill_line(EditLine *el,wint_t c)

{
  wchar_t *local_28;
  wchar_t *cp;
  wchar_t *kp;
  wint_t c_local;
  EditLine *el_local;
  
  local_28 = (el->el_line).buffer;
  cp = (el->el_chared).c_kill.buf;
  while (local_28 < (el->el_line).lastchar) {
    *cp = *local_28;
    local_28 = local_28 + 1;
    cp = cp + 1;
  }
  (el->el_chared).c_kill.last = cp;
  (el->el_line).lastchar = (el->el_line).buffer;
  (el->el_line).cursor = (el->el_line).buffer;
  return '\x04';
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
em_kill_line(EditLine *el, wint_t c __attribute__((__unused__)))
{
	wchar_t *kp, *cp;

	cp = el->el_line.buffer;
	kp = el->el_chared.c_kill.buf;
	while (cp < el->el_line.lastchar)
		*kp++ = *cp++;	/* copy it */
	el->el_chared.c_kill.last = kp;
				/* zap! -- delete all of it */
	el->el_line.lastchar = el->el_line.buffer;
	el->el_line.cursor = el->el_line.buffer;
	return CC_REFRESH;
}